

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_moves(vector<Card,_std::allocator<Card>_> *cards)

{
  ostream *poVar1;
  pointer this;
  string local_50;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Printing moves....");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (this = (cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
              super__Vector_impl_data._M_start;
      this != (cards->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
              super__Vector_impl_data._M_finish; this = this + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Card is ");
    Card::Card2Str_abi_cxx11_(&local_50,this);
    poVar1 = std::operator<<(poVar1,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_50);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"....");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void print_moves(std::vector<Card> cards)
{
    std::cout << "Printing moves...." << std::endl;
    for(std::vector<Card>::iterator it = cards.begin(); it != cards.end(); ++it) {
        std::cout << "Card is " << it->Card2Str() << std::endl;
    }
    std::cout << "...." << std::endl;
}